

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> __thiscall
kj::anon_unknown_0::SocketNetwork::parseAddress(SocketNetwork *this,StringPtr addr,uint portHint)

{
  NetworkFilter *this_00;
  Detail *pDVar1;
  OwnPromiseNode node;
  size_t sVar2;
  PromiseBase PVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  void *pvVar7;
  SocketAddress *pSVar8;
  ulong uVar9;
  void *pvVar10;
  int *piVar11;
  undefined4 in_register_0000000c;
  ulong uVar12;
  ulong size;
  ArrayDisposer *pAVar13;
  NetworkFilter *in_R8;
  NetworkFilter *filter;
  long *value;
  uint uVar14;
  Exception *e;
  ulong uVar15;
  TransformPromiseNodeBase *this_01;
  char *pcVar16;
  unsigned_long port;
  OwnPromiseNode local_740;
  Fault f_6;
  int af;
  char *endptr;
  uint local_720;
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  StringPtr local_6d8;
  String local_6c8;
  String local_6a8;
  String local_688;
  String local_668 [3];
  PromiseBase local_620;
  Array<kj::(anonymous_namespace)::SocketAddress> result_3;
  Array<kj::(anonymous_namespace)::SocketAddress> result_2;
  Array<kj::(anonymous_namespace)::SocketAddress> result_1;
  Array<kj::(anonymous_namespace)::SocketAddress> result;
  uint local_5a0;
  undefined1 local_59c;
  sockaddr local_598 [10];
  Fault f_3;
  
  pvVar10 = (void *)CONCAT44(in_register_0000000c,portHint);
  value = (long *)addr.content.size_;
  pAVar13 = (ArrayDisposer *)addr.content.ptr;
  uVar9 = (ulong)in_R8 & 0xffffffff;
  local_740.ptr = (PromiseNode *)0x0;
  this_00 = (NetworkFilter *)(pAVar13 + 2);
  filter = in_R8;
  local_6d8.content.ptr = (char *)value;
  local_6d8.content.size_ = (size_t)pvVar10;
  local_620.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  memset(&local_5a0,0,0x88);
  uVar12 = (long)pvVar10 - 1;
  uVar14 = (uint)in_R8;
  if (uVar12 < 5) {
    if (uVar12 != 0) goto LAB_0042c980;
LAB_0042ca02:
    _kjCondition.right = 0;
    _kjCondition.left = 0;
    pvVar7 = memchr(value,0x3a,uVar12);
    bVar4 = pvVar7 != (void *)0x0;
    if (pvVar7 == (void *)0x0) {
      af = 2;
      iVar6 = 2;
      size = uVar12;
      _kjCondition.left = (unsigned_long)value;
      _kjCondition.right = uVar12;
    }
    else {
      size = (long)pvVar7 - (long)value;
      pcVar16 = (char *)((long)pvVar7 + 1);
      local_720 = uVar14;
      pvVar7 = memchr(pcVar16,0x3a,(long)pvVar10 + (~size - 1));
      if (pvVar7 == (void *)0x0) {
        uVar15 = ~size + (long)pvVar10;
        af = 2;
        iVar6 = 2;
        bVar4 = false;
LAB_0042ce28:
        _kjCondition.left = (unsigned_long)value;
        _kjCondition.right = size;
        uVar9 = strtoul(pcVar16,&endptr,0);
        port = uVar9;
        if ((uVar15 == 1) || (*endptr != '\0')) {
          heapString(&local_688,(char *)value,size);
          heapString(&local_6a8,pcVar16,uVar15 - 1);
          SocketAddress::lookupHost
                    ((LowLevelAsyncIoProvider *)&f_6,&local_688,&local_6a8,local_720,filter);
          sVar2 = local_6a8.content.size_;
          pcVar16 = local_6a8.content.ptr;
          if (local_6a8.content.ptr != (char *)0x0) {
            local_6a8.content.ptr = (char *)0x0;
            local_6a8.content.size_ = 0;
            (**(local_6a8.content.disposer)->_vptr_ArrayDisposer)
                      (local_6a8.content.disposer,pcVar16,1,sVar2,sVar2,0);
          }
          sVar2 = local_688.content.size_;
          pcVar16 = local_688.content.ptr;
          if (local_688.content.ptr != (char *)0x0) {
            local_688.content.ptr = (char *)0x0;
            local_688.content.size_ = 0;
            (**(local_688.content.disposer)->_vptr_ArrayDisposer)
                      (local_688.content.disposer,pcVar16,1,sVar2,sVar2,0);
          }
          goto LAB_0042d0c9;
        }
        f_3.exception = (Exception *)&port;
        if (0xffff < uVar9) {
          f_3.exception = (Exception *)&port;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[23]>
                    (&f_6,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x448,FAILED,"port < 65536","_kjCondition,\"Port number too large.\"",
                     (DebugComparison<unsigned_long_&,_int> *)&f_3,
                     (char (*) [23])"Port number too large.");
          kj::_::Debug::Fault::fatal(&f_6);
        }
      }
      else {
        af = 10;
        iVar6 = 10;
        uVar9 = (ulong)local_720;
        size = uVar12;
        _kjCondition.left = (unsigned_long)value;
        _kjCondition.right = uVar12;
      }
    }
  }
  else {
    if (*(char *)((long)value + 4) == ':' && (int)*value == 0x78696e75) {
      uVar12 = (long)pvVar10 - 6;
      _kjCondition.right = 0x6c;
      _kjCondition.op.content.ptr = " < ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = uVar12 < 0x6c;
      _kjCondition.left = uVar12;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[40],kj::StringPtr&>
                  ((Fault *)&port,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x3ef,FAILED,"path.size() < sizeof(addr.unixDomain.sun_path)",
                   "_kjCondition,\"Unix domain socket address is too long.\", str",&_kjCondition,
                   (char (*) [40])"Unix domain socket address is too long.",&local_6d8);
        kj::_::Debug::Fault::fatal((Fault *)&port);
      }
      _kjCondition.right = strlen((char *)((long)value + 5));
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = uVar12 == _kjCondition.right;
      if (!_kjCondition.result) {
        _kjCondition.left = uVar12;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[91]>
                  ((Fault *)&port,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x3f2,FAILED,"path.size() == strlen(path.cStr())",
                   "_kjCondition,\"Unix domain socket address contains NULL. Use\" \" \'unix-abstract:\' for the abstract namespace.\""
                   ,&_kjCondition,
                   (char (*) [91])
                   "Unix domain socket address contains NULL. Use \'unix-abstract:\' for the abstract namespace."
                  );
        kj::_::Debug::Fault::fatal((Fault *)&port);
      }
      local_598[0].sa_family = 1;
      _kjCondition.left = uVar12;
      strcpy(local_598[0].sa_data,(char *)((long)value + 5));
      local_5a0 = (int)uVar12 + 3;
      bVar4 = kj::_::NetworkFilter::shouldAllowParse(this_00,local_598,local_5a0);
      if (!bVar4) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x3f8,FAILED,(char *)0x0,"\"unix sockets blocked by restrictPeers()\"",
                   (char (*) [40])0x4fff7d);
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      pSVar8 = (SocketAddress *)
               kj::_::HeapArrayDisposer::allocateImpl
                         (0x88,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      memcpy(pSVar8,&local_5a0,0x88);
      result.size_ = 1;
      result.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      result.ptr = pSVar8;
      Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::Promise
                ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&f_6,&result);
      sVar2 = result.size_;
      pSVar8 = result.ptr;
      if (result.ptr != (SocketAddress *)0x0) {
        result.ptr = (SocketAddress *)0x0;
        result.size_ = 0;
        (**(result.disposer)->_vptr_ArrayDisposer)(result.disposer,pSVar8,0x88,sVar2,sVar2,0);
      }
      goto LAB_0042d0c9;
    }
    if ((0xd < uVar12) &&
       (*(long *)((long)value + 6) == 0x3a74636172747362 && *value == 0x7362612d78696e75)) {
      _kjCondition.left = (long)pvVar10 - 0xe;
      _kjCondition.right = 0x6c;
      _kjCondition.op.content.ptr = " < ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = _kjCondition.left < 0x6c;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[40],kj::StringPtr&>
                  ((Fault *)&port,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x404,FAILED,"path.size() + 1 < sizeof(addr.unixDomain.sun_path)",
                   "_kjCondition,\"Unix domain socket address is too long.\", str",&_kjCondition,
                   (char (*) [40])"Unix domain socket address is too long.",&local_6d8);
        kj::_::Debug::Fault::fatal((Fault *)&port);
      }
      local_598[0].sa_family = 1;
      local_598[0].sa_data._0_2_ = local_598[0].sa_data._0_2_ & 0xff00;
      memcpy(local_598[0].sa_data + 1,(char *)((long)value + 0xe),_kjCondition.left);
      local_5a0 = portHint - 0xc;
      bVar4 = kj::_::NetworkFilter::shouldAllowParse(this_00,local_598,local_5a0);
      if (!bVar4) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x40d,FAILED,(char *)0x0,"\"abstract unix sockets blocked by restrictPeers()\"",
                   (char (*) [49])"abstract unix sockets blocked by restrictPeers()");
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      pSVar8 = (SocketAddress *)
               kj::_::HeapArrayDisposer::allocateImpl
                         (0x88,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      memcpy(pSVar8,&local_5a0,0x88);
      result_1.size_ = 1;
      result_1.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      result_1.ptr = pSVar8;
      Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::Promise
                ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&f_6,&result_1);
      sVar2 = result_1.size_;
      pSVar8 = result_1.ptr;
      if (result_1.ptr != (SocketAddress *)0x0) {
        result_1.ptr = (SocketAddress *)0x0;
        result_1.size_ = 0;
        (**(result_1.disposer)->_vptr_ArrayDisposer)(result_1.disposer,pSVar8,0x88,sVar2,sVar2,0);
      }
      goto LAB_0042d0c9;
    }
LAB_0042c980:
    _kjCondition.right = 0;
    _kjCondition.left = 0;
    if ((char)*value != '[') goto LAB_0042ca02;
    af = 10;
    pcVar16 = (char *)((long)value + (long)pvVar10);
    uVar15 = 0;
    do {
      uVar9 = uVar15;
      if ((long)pvVar10 + uVar9 == 1) {
        local_720 = uVar14;
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32],kj::StringPtr&>
                  (&f_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x422,FAILED,"str.findLast(\']\') != nullptr",
                   "\"Unclosed \'[\' in address string.\", str",
                   (char (*) [32])"Unclosed \'[\' in address string.",&local_6d8);
        kj::_::Debug::Fault::fatal(&f_3);
      }
      uVar15 = uVar9 - 1;
    } while (pcVar16[uVar9 - 2] != ']');
    value = (long *)((long)value + 1);
    size = (long)pvVar10 + (uVar9 - 3);
    _kjCondition.left = (unsigned_long)value;
    _kjCondition.right = size;
    if ((long)pvVar10 + uVar15 < uVar12) {
      port = CONCAT71(port._1_7_,pcVar16[uVar15] == ':');
      if (pcVar16[uVar15] != ':') {
        local_720 = uVar14;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[32],kj::StringPtr&>
                  (&f_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x427,FAILED,"str.slice(closeBracket + 1).startsWith(\":\")",
                   "_kjCondition,\"Expected port suffix after \']\'.\", str",
                   (DebugExpression<bool> *)&port,(char (*) [32])"Expected port suffix after \']\'."
                   ,&local_6d8);
        kj::_::Debug::Fault::fatal(&f_3);
      }
      pcVar16 = pcVar16 + uVar9;
      uVar15 = ~uVar15;
      iVar6 = 10;
      bVar4 = true;
      local_720 = uVar14;
      goto LAB_0042ce28;
    }
    iVar6 = 10;
    bVar4 = true;
    uVar9 = (ulong)in_R8 & 0xffffffff;
    local_720 = uVar14;
  }
  uVar5 = (ushort)uVar9;
  port = uVar9;
  if ((size == 1) && ((char)*value == '*')) {
    local_59c = 1;
    local_5a0 = 0x1c;
    local_598[0].sa_family = 10;
    local_598[0].sa_data._0_2_ = uVar5 << 8 | uVar5 >> 8;
    pSVar8 = (SocketAddress *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (0x88,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    memcpy(pSVar8,&local_5a0,0x88);
    result_2.size_ = 1;
    result_2.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    result_2.ptr = pSVar8;
    Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::Promise
              ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&f_6,&result_2);
    sVar2 = result_2.size_;
    pSVar8 = result_2.ptr;
    if (result_2.ptr != (SocketAddress *)0x0) {
      result_2.ptr = (SocketAddress *)0x0;
      result_2.size_ = 0;
      (**(result_2.disposer)->_vptr_ArrayDisposer)(result_2.disposer,pSVar8,0x88,sVar2,sVar2,0);
    }
  }
  else {
    local_598[0].sa_data._0_2_ = uVar5 << 8 | uVar5 >> 8;
    local_5a0 = 0x10;
    if (bVar4 != false) {
      local_5a0 = 0x1c;
    }
    local_598[0].sa_family = (ushort)bVar4 * 8 + 2;
    if (size < 0x2d) {
      f_3.exception = (Exception *)0x0;
      memcpy(&f_3,value,size);
      *(undefined1 *)((long)&f_3.exception + size) = 0;
      iVar6 = inet_pton(iVar6,(char *)&f_3,local_598[0].sa_data + (ulong)bVar4 * 4 + 2);
      if (iVar6 == 1) {
        bVar4 = kj::_::NetworkFilter::shouldAllowParse(this_00,local_598,local_5a0);
        if (!bVar4) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
                    ((Fault *)&endptr,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x47a,FAILED,(char *)0x0,"\"address family blocked by restrictPeers()\"",
                     (char (*) [42])"address family blocked by restrictPeers()");
          kj::_::Debug::Fault::fatal((Fault *)&endptr);
        }
        pSVar8 = (SocketAddress *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x88,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
        memcpy(pSVar8,&local_5a0,0x88);
        result_3.size_ = 1;
        result_3.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        result_3.ptr = pSVar8;
        Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::Promise
                  ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&f_6,&result_3);
        sVar2 = result_3.size_;
        pSVar8 = result_3.ptr;
        if (result_3.ptr != (SocketAddress *)0x0) {
          result_3.ptr = (SocketAddress *)0x0;
          result_3.size_ = 0;
          (**(result_3.disposer)->_vptr_ArrayDisposer)(result_3.disposer,pSVar8,0x88,sVar2,sVar2,0);
        }
        goto LAB_0042d0c9;
      }
      if (iVar6 != 0) {
        piVar11 = __errno_location();
        kj::_::Debug::Fault::Fault<int,int&,kj::ArrayPtr<char_const>&>
                  ((Fault *)&endptr,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x486,*piVar11,"inet_pton","af, addrPart",&af,
                   (ArrayPtr<const_char> *)&_kjCondition);
        kj::_::Debug::Fault::fatal((Fault *)&endptr);
      }
    }
    heapString(&local_6c8,(char *)value,size);
    local_668[0].content.ptr = (char *)0x0;
    local_668[0].content.size_ = 0;
    local_668[0].content.disposer = (ArrayDisposer *)0x0;
    SocketAddress::lookupHost
              ((LowLevelAsyncIoProvider *)&f_6,&local_6c8,local_668,(uint)port,filter);
    sVar2 = local_668[0].content.size_;
    pcVar16 = local_668[0].content.ptr;
    if (local_668[0].content.ptr != (char *)0x0) {
      local_668[0].content.ptr = (char *)0x0;
      local_668[0].content.size_ = 0;
      (**(local_668[0].content.disposer)->_vptr_ArrayDisposer)
                (local_668[0].content.disposer,pcVar16,1,sVar2,sVar2,0);
    }
    sVar2 = local_6c8.content.size_;
    pcVar16 = local_6c8.content.ptr;
    if (local_6c8.content.ptr != (char *)0x0) {
      local_6c8.content.ptr = (char *)0x0;
      local_6c8.content.size_ = 0;
      (**(local_6c8.content.disposer)->_vptr_ArrayDisposer)
                (local_6c8.content.disposer,pcVar16,1,sVar2,sVar2,0);
    }
  }
LAB_0042d0c9:
  local_740.ptr = (PromiseNode *)f_6.exception;
  pDVar1 = (Detail *)((f_6.exception)->ownFile).content.size_;
  if (pDVar1 == (Detail *)0x0 || (ulong)((long)f_6.exception - (long)pDVar1) < 0x28) {
    pvVar10 = operator_new(0x400);
    this_01 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_740,
               kj::_::
               SimpleTransformPromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1741:13)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_00624df8;
    *(ArrayDisposer **)((long)pvVar10 + 0x3f8) = pAVar13;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  else {
    ((f_6.exception)->ownFile).content.size_ = 0;
    this_01 = (TransformPromiseNodeBase *)&f_6.exception[-1].traceCount;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_740,
               kj::_::
               SimpleTransformPromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1741:13)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)&f_6.exception[-1].traceCount = &PTR_destroy_00624df8;
    f_6.exception[-1].details.builder.disposer = pAVar13;
    f_6.exception[-1].details.builder.ptr = pDVar1;
  }
  PVar3.node.ptr = local_620.node.ptr;
  node.ptr = local_740.ptr;
  *(TransformPromiseNodeBase **)local_620.node.ptr = this_01;
  if ((Exception *)local_740.ptr != (Exception *)0x0) {
    local_740.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>)(PromiseNode *)PVar3.node.ptr;
}

Assistant:

Promise<Own<NetworkAddress>> parseAddress(StringPtr addr, uint portHint = 0) override {
    return evalNow([&]() {
      return SocketAddress::parse(lowLevel, addr, portHint, filter);
    }).then([this](Array<SocketAddress> addresses) -> Own<NetworkAddress> {
      return heap<NetworkAddressImpl>(lowLevel, filter, kj::mv(addresses));
    });
  }